

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

int32 ps_lattice_joint(ps_lattice_t *dag,ps_latlink_t *link,float32 ascale)

{
  s3wid_t w;
  int iVar1;
  int32 iVar2;
  bool bVar3;
  bool bVar4;
  ps_latlink_t *local_48;
  ps_latlink_t *prev_link;
  int16 to_is_fil;
  int16 from_is_fil;
  int32 to_wid;
  int32 from_wid;
  int lback;
  int32 jprob;
  ngram_model_t *lmset;
  ps_latlink_s *ppStack_18;
  float32 ascale_local;
  ps_latlink_t *link_local;
  ps_lattice_t *dag_local;
  
  lmset._4_4_ = ascale;
  ppStack_18 = link;
  link_local = (ps_latlink_t *)dag;
  if ((dag->search == (ps_search_t *)0x0) || (iVar1 = strcmp(dag->search->type,"ngram"), iVar1 != 0)
     ) {
    _lback = (ngram_model_t *)0x0;
  }
  else {
    _lback = (ngram_model_t *)link_local->best_prev[2].best_prev;
  }
  from_wid = (int32)((float)(link_local[1].ascr << 10) * (float)lmset._4_4_);
  do {
    if (ppStack_18 == (ps_latlink_t *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
              ,0x5a3,"Joint P(O,S) = %d P(S|O) = %d\n",(ulong)(uint)from_wid,
              (ulong)(uint)(from_wid - link_local[1].path_scr));
      return from_wid;
    }
    if (_lback != (ngram_model_t *)0x0) {
      _to_is_fil = ppStack_18->from->basewid;
      w = ppStack_18->to->basewid;
      iVar1 = dict_filler_word(*(dict_t **)&link_local->ascr,_to_is_fil);
      bVar3 = false;
      if (iVar1 != 0) {
        bVar3 = ppStack_18->from != link_local[1].from;
      }
      iVar1 = dict_filler_word(*(dict_t **)&link_local->ascr,w);
      bVar4 = false;
      if (iVar1 != 0) {
        bVar4 = ppStack_18->to != link_local[1].to;
      }
      if ((!bVar4) && (bVar3)) {
        local_48 = ppStack_18;
        do {
          if (local_48->best_prev == (ps_latlink_s *)0x0) goto LAB_00118d5e;
          local_48 = local_48->best_prev;
          _to_is_fil = local_48->from->basewid;
          iVar1 = dict_filler_word(*(dict_t **)&link_local->ascr,_to_is_fil);
        } while ((iVar1 != 0) && (local_48->from != link_local[1].from));
        bVar3 = false;
      }
LAB_00118d5e:
      if ((!bVar3) && (!bVar4)) {
        iVar2 = ngram_ng_prob(_lback,w,(int32 *)&to_is_fil,1,&to_wid);
        from_wid = iVar2 + from_wid;
      }
    }
    from_wid = (int)((float)(ppStack_18->ascr << 10) * (float)lmset._4_4_) + from_wid;
    ppStack_18 = ppStack_18->best_prev;
  } while( true );
}

Assistant:

static int32
ps_lattice_joint(ps_lattice_t *dag, ps_latlink_t *link, float32 ascale)
{
    ngram_model_t *lmset;
    int32 jprob;

    /* Sort of a hack... */
    if (dag->search && 0 == strcmp(ps_search_type(dag->search), PS_SEARCH_TYPE_NGRAM))
        lmset = ((ngram_search_t *)dag->search)->lmset;
    else
        lmset = NULL;

    jprob = (int32)((dag->final_node_ascr << SENSCR_SHIFT) * ascale);
    while (link) {
        if (lmset) {
            int lback;
            int32 from_wid, to_wid;
            int16 from_is_fil, to_is_fil;

            from_wid = link->from->basewid;
            to_wid = link->to->basewid;
            from_is_fil = dict_filler_word(dag->dict, from_wid) && link->from != dag->start;
            to_is_fil = dict_filler_word(dag->dict, to_wid) && link->to != dag->end;

            /* Find word predecessor if from-word is filler */
            if (!to_is_fil && from_is_fil) {
                ps_latlink_t *prev_link = link;
                while (prev_link->best_prev != NULL) {
                    prev_link = prev_link->best_prev;
                    from_wid = prev_link->from->basewid;
                    if (!dict_filler_word(dag->dict, from_wid) || prev_link->from == dag->start) {
                        from_is_fil = FALSE;
                        break;
                    }
                }
            }

            /* Compute unscaled language model probability.  Note that
               this is actually not the language model probability
               that corresponds to this link, but that is okay,
               because we are just taking the sum over all links in
               the best path. */
            if (!from_is_fil && !to_is_fil)
                jprob += ngram_ng_prob(lmset, to_wid,
                                       &from_wid, 1, &lback);
        }
        /* If there is no language model, we assume that the language
           model probability (such as it is) has been included in the
           link score. */
        jprob += (int32)((link->ascr << SENSCR_SHIFT) * ascale);
        link = link->best_prev;
    }

    E_INFO("Joint P(O,S) = %d P(S|O) = %d\n", jprob, jprob - dag->norm);
    return jprob;
}